

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O1

void __thiscall LR::loadStr(LR *this,string *in)

{
  iterator __position;
  ulong uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  split(&local_50,in,' ');
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"#","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->inStr,
             &local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  local_38._M_dataplus._M_p = local_38._M_dataplus._M_p & 0xffffffff00000000;
  __position._M_current =
       (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->status,__position,(int *)&local_38);
  }
  else {
    *__position._M_current = 0;
    (this->status).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  uVar1 = (ulong)((long)local_50.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_50.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->inStr,
                local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ((uint)uVar1 & 0x7fffffff));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  return;
}

Assistant:

void LR::loadStr(string &in) {
//    cout << "loadStr..." << endl;
    vector<std::string> s = split(in, ' ');
    inStr.push_back("#");
    status.push_back(0);
    for (int i = s.size() - 1; i >= 0; --i) {
        inStr.push_back(s[i]);
    }
}